

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O3

unsigned_long_long * __thiscall
CJSON::GetValue<unsigned_long_long*>(CJSON *this,string *Name,size_t *Size)

{
  int iVar1;
  iterator iVar2;
  unsigned_long_long *__dest;
  ulong __n;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_38;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,Name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->m_Values)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = std::__cxx11::string::compare((char *)(iVar2._M_node + 2));
    if (iVar1 != 0) {
      ParseValue<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_nullptr>
                (&local_38,this,(string *)(iVar2._M_node + 2));
      __n = (long)local_38.
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_38.
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      *Size = (long)__n >> 3;
      __dest = (unsigned_long_long *)
               operator_new__(-(ulong)((ulong)((long)__n >> 3) >> 0x3d != 0) | __n);
      memcpy(__dest,local_38.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,__n);
      if (local_38.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return __dest;
      }
      operator_delete(local_38.
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return __dest;
    }
  }
  *Size = 0;
  return (unsigned_long_long *)0x0;
}

Assistant:

T GetValue(const std::string &Name, size_t &Size)
        {
            std::map<std::string, std::string>::iterator IT = m_Values.find(Name);
            if(IT == m_Values.end())
            {
                Size = 0;
                return nullptr;
            }

            if(IT->second == "null")
            {
                Size = 0;
                return AddNullObj<T>();
            }

            return ParseArray<T>(IT->second, Size);
        }